

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portability_path_test.cpp
# Opt level: O0

void __thiscall
portability_path_test_portability_path_test_canonical_begin_double_dot_Test::TestBody
          (portability_path_test_portability_path_test_canonical_begin_double_dot_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  size_t size;
  string_path canonical;
  unsigned_long *in_stack_ffffffffffffef10;
  unsigned_long *in_stack_ffffffffffffef18;
  AssertionResult *this_00;
  undefined7 in_stack_ffffffffffffef20;
  undefined1 in_stack_ffffffffffffef27;
  char *in_stack_ffffffffffffef28;
  AssertHelper local_10a0;
  Message local_1098;
  char local_108a;
  undefined1 local_1089;
  AssertionResult local_1088;
  AssertHelper local_1078;
  Message local_1070;
  undefined8 local_1068;
  long local_1060;
  AssertionResult local_1058;
  AssertHelper local_1048;
  Message local_1040 [3];
  int local_1028;
  undefined4 local_1024;
  AssertionResult local_1020;
  long local_1010;
  char local_1008 [4104];
  
  local_1010 = portability_path_canonical("../a/b/c",9,local_1008,0x1000);
  local_1024 = 0;
  local_1028 = strcmp(local_1008,"a/b/c");
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_ffffffffffffef28,
             (char *)CONCAT17(in_stack_ffffffffffffef27,in_stack_ffffffffffffef20),
             (int *)in_stack_ffffffffffffef18,(int *)in_stack_ffffffffffffef10);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1020);
  if (!bVar1) {
    testing::Message::Message(local_1040);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x11b661);
    testing::internal::AssertHelper::AssertHelper
              (&local_1048,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/portability_path_test/source/portability_path_test.cpp"
               ,0x18e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1048,local_1040);
    testing::internal::AssertHelper::~AssertHelper(&local_1048);
    testing::Message::~Message((Message *)0x11b6be);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11b713);
  local_1060 = local_1010;
  local_1068 = 6;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            (in_stack_ffffffffffffef28,
             (char *)CONCAT17(in_stack_ffffffffffffef27,in_stack_ffffffffffffef20),
             in_stack_ffffffffffffef18,in_stack_ffffffffffffef10);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1058);
  if (!bVar1) {
    testing::Message::Message(&local_1070);
    in_stack_ffffffffffffef28 =
         testing::AssertionResult::failure_message((AssertionResult *)0x11b7c5);
    testing::internal::AssertHelper::AssertHelper
              (&local_1078,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/portability_path_test/source/portability_path_test.cpp"
               ,399,in_stack_ffffffffffffef28);
    testing::internal::AssertHelper::operator=(&local_1078,&local_1070);
    testing::internal::AssertHelper::~AssertHelper(&local_1078);
    testing::Message::~Message((Message *)0x11b822);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11b877);
  local_1089 = 0;
  local_108a = "../a/b/c"[local_1010 + 8];
  this_00 = &local_1088;
  testing::internal::EqHelper::Compare<char,_char,_nullptr>
            (in_stack_ffffffffffffef28,
             (char *)CONCAT17(in_stack_ffffffffffffef27,in_stack_ffffffffffffef20),
             &this_00->success_,(char *)in_stack_ffffffffffffef10);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
  if (!bVar1) {
    testing::Message::Message(&local_1098);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x11b91a);
    testing::internal::AssertHelper::AssertHelper
              (&local_10a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/portability_path_test/source/portability_path_test.cpp"
               ,400,pcVar2);
    testing::internal::AssertHelper::operator=(&local_10a0,&local_1098);
    testing::internal::AssertHelper::~AssertHelper(&local_10a0);
    testing::Message::~Message((Message *)0x11b968);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11b9b4);
  return;
}

Assistant:

TEST_F(portability_path_test, portability_path_test_canonical_begin_double_dot)
{
	static const char path[] = "../a/b/c";
	static const char result[] = "a/b/c";

	string_path canonical;

	size_t size = portability_path_canonical(path, sizeof(path), canonical, PATH_SIZE);

	EXPECT_EQ((int)0, (int)strcmp(canonical, result));
	EXPECT_EQ((size_t)size, (size_t)sizeof(result));
	EXPECT_EQ((char)'\0', (char)result[size - 1]);
}